

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  OneofOptions *pOVar1;
  OneofOptions *pOVar2;
  
  OneofDescriptorProto::_internal_set_name(proto,*(string **)this);
  pOVar2 = *(OneofOptions **)(this + 0x28);
  pOVar1 = OneofOptions::default_instance();
  if (pOVar2 != pOVar1) {
    pOVar2 = OneofDescriptorProto::_internal_mutable_options(proto);
    OneofOptions::CopyFrom(pOVar2,*(OneofOptions **)(this + 0x28));
    return;
  }
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}